

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall deqp::gles31::Functional::anon_unknown_1::ClearCase::createProgram(ClearCase *this)

{
  Context *pCVar1;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> data_00;
  bool bVar2;
  ShaderProgram *pSVar3;
  RenderContext *pRVar4;
  Context *pCVar5;
  ProgramSources *pPVar6;
  TestLog *pTVar7;
  ShaderProgram *pSVar8;
  TestError *pTVar9;
  ShaderProgram *in_stack_fffffffffffff828;
  undefined8 in_stack_fffffffffffff830;
  allocator<char> *__a;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  LogSection local_648;
  DefaultDeleter<glu::ShaderProgram> local_602;
  undefined1 local_601;
  string local_600;
  string local_5e0;
  ShaderSource local_5c0;
  string local_598;
  string local_578;
  ShaderSource local_558;
  string local_530;
  string local_510;
  ShaderSource local_4f0;
  string local_4c8;
  string local_4a8;
  ShaderSource local_488;
  ProgramSources local_460;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_390;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_380;
  undefined1 local_36a;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  LogSection local_2f8;
  DefaultDeleter<glu::ShaderProgram> local_2b2;
  undefined1 local_2b1;
  string local_2b0;
  string local_290;
  ShaderSource local_270;
  string local_248;
  string local_228;
  ShaderSource local_208;
  string local_1e0;
  string local_1c0;
  ShaderSource local_1a0;
  string local_178;
  string local_158;
  ShaderSource local_138;
  ProgramSources local_100;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_30;
  PtrData<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_20;
  ClearCase *local_10;
  ClearCase *this_local;
  
  local_10 = this;
  pSVar3 = (ShaderProgram *)operator_new(0xd0);
  local_2b1 = 1;
  pSVar8 = pSVar3;
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_100);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ClearCase::genVertexSource_abi_cxx11_(&local_178,this);
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_158,(_anonymous_namespace_ *)pCVar1,pCVar5,(char *)pSVar8);
  glu::VertexSource::VertexSource((VertexSource *)&local_138,&local_158);
  pPVar6 = glu::ProgramSources::operator<<(&local_100,&local_138);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ClearCase::genFragmentSource_abi_cxx11_(&local_1e0,this);
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1c0,(_anonymous_namespace_ *)pCVar1,pCVar5,(char *)pSVar8);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_1a0,&local_1c0);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_1a0);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ClearCase::genTessellationControlSource_abi_cxx11_
            (&local_248,this,false);
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_228,(_anonymous_namespace_ *)pCVar1,pCVar5,(char *)pSVar8);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_208,&local_228);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_208);
  pCVar1 = (this->super_TestCase).m_context;
  Functional::(anonymous_namespace)::ClearCase::genTessellationEvaluationSource_abi_cxx11_
            (&local_2b0,this);
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_290,(_anonymous_namespace_ *)pCVar1,pCVar5,(char *)pSVar8);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_270,&local_290);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_270);
  glu::ShaderProgram::ShaderProgram(pSVar3,pRVar4,pPVar6);
  local_2b1 = 0;
  de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter(&local_2b2);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_30);
  local_20 = de::details::MovePtr::operator_cast_to_PtrData(&local_30,(MovePtr *)pSVar3);
  data._8_8_ = in_stack_fffffffffffff830;
  data.ptr = in_stack_fffffffffffff828;
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
            (&this->m_basicProgram,data);
  de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
            ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_30);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  glu::ProgramSources::~ProgramSources(&local_100);
  pTVar7 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"Program",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_340,"Shader program",&local_341);
  tcu::LogSection::LogSection(&local_2f8,&local_318,&local_340);
  pTVar7 = tcu::TestLog::operator<<(pTVar7,&local_2f8);
  pSVar8 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator*(&(this->m_basicProgram).
                      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>)
  ;
  pTVar7 = glu::operator<<(pTVar7,pSVar8);
  tcu::TestLog::operator<<(pTVar7,(EndSectionToken *)&tcu::TestLog::EndSection);
  tcu::LogSection::~LogSection(&local_2f8);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  pSVar8 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
           operator->(&(this->m_basicProgram).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                     );
  bVar2 = glu::ShaderProgram::isOk(pSVar8);
  if (!bVar2) {
    local_36a = 1;
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,"shader build failed",&local_369);
    tcu::TestError::TestError(pTVar9,&local_368);
    local_36a = 0;
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if ((this->m_useGlobalState & 1U) == 0) {
    pSVar3 = (ShaderProgram *)operator_new(0xd0);
    local_601 = 1;
    pSVar8 = pSVar3;
    pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    glu::ProgramSources::ProgramSources(&local_460);
    pCVar1 = (this->super_TestCase).m_context;
    Functional::(anonymous_namespace)::ClearCase::genVertexSource_abi_cxx11_(&local_4c8,this);
    pCVar5 = (Context *)std::__cxx11::string::c_str();
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_4a8,(_anonymous_namespace_ *)pCVar1,pCVar5,(char *)pSVar8);
    glu::VertexSource::VertexSource((VertexSource *)&local_488,&local_4a8);
    pPVar6 = glu::ProgramSources::operator<<(&local_460,&local_488);
    pCVar1 = (this->super_TestCase).m_context;
    Functional::(anonymous_namespace)::ClearCase::genFragmentSource_abi_cxx11_(&local_530,this);
    pCVar5 = (Context *)std::__cxx11::string::c_str();
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_510,(_anonymous_namespace_ *)pCVar1,pCVar5,(char *)pSVar8);
    glu::FragmentSource::FragmentSource((FragmentSource *)&local_4f0,&local_510);
    pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_4f0);
    pCVar1 = (this->super_TestCase).m_context;
    Functional::(anonymous_namespace)::ClearCase::genTessellationControlSource_abi_cxx11_
              (&local_598,this,true);
    pCVar5 = (Context *)std::__cxx11::string::c_str();
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_578,(_anonymous_namespace_ *)pCVar1,pCVar5,(char *)pSVar8);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)&local_558,&local_578);
    pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_558);
    pCVar1 = (this->super_TestCase).m_context;
    Functional::(anonymous_namespace)::ClearCase::genTessellationEvaluationSource_abi_cxx11_
              (&local_600,this);
    pCVar5 = (Context *)std::__cxx11::string::c_str();
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_5e0,(_anonymous_namespace_ *)pCVar1,pCVar5,(char *)pSVar8);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_5c0,&local_5e0);
    pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_5c0);
    glu::ShaderProgram::ShaderProgram(pSVar3,pRVar4,pPVar6);
    local_601 = 0;
    de::DefaultDeleter<glu::ShaderProgram>::DefaultDeleter(&local_602);
    de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::MovePtr
              ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_390);
    local_380 = de::details::MovePtr::operator_cast_to_PtrData(&local_390,(MovePtr *)pSVar3);
    data_00._8_8_ = in_stack_fffffffffffff830;
    data_00.ptr = in_stack_fffffffffffff828;
    de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::operator=
              (&this->m_perPrimitiveProgram,data_00);
    de::details::MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::~MovePtr
              ((MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)&local_390);
    glu::TessellationEvaluationSource::~TessellationEvaluationSource
              ((TessellationEvaluationSource *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_600);
    glu::TessellationControlSource::~TessellationControlSource
              ((TessellationControlSource *)&local_558);
    std::__cxx11::string::~string((string *)&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    glu::FragmentSource::~FragmentSource((FragmentSource *)&local_4f0);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    glu::VertexSource::~VertexSource((VertexSource *)&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string((string *)&local_4c8);
    glu::ProgramSources::~ProgramSources(&local_460);
    pTVar7 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_668,"PerPrimitiveProgram",&local_669);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_690,"Shader program that sets the bounding box",&local_691);
    tcu::LogSection::LogSection(&local_648,&local_668,&local_690);
    pTVar7 = tcu::TestLog::operator<<(pTVar7,&local_648);
    pSVar8 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
             operator*(&(this->m_perPrimitiveProgram).
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
    pTVar7 = glu::operator<<(pTVar7,pSVar8);
    tcu::TestLog::operator<<(pTVar7,(EndSectionToken *)&tcu::TestLog::EndSection);
    tcu::LogSection::~LogSection(&local_648);
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
    std::__cxx11::string::~string((string *)&local_668);
    std::allocator<char>::~allocator(&local_669);
    pSVar8 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
             operator->(&(this->m_perPrimitiveProgram).
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       );
    bVar2 = glu::ShaderProgram::isOk(pSVar8);
    if (!bVar2) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      __a = &local_6b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6b8,"shader build failed",__a);
      tcu::TestError::TestError(pTVar9,&local_6b8);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  return;
}

Assistant:

void ClearCase::createProgram (void)
{
	m_basicProgram = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(),
																			glu::ProgramSources()
																				<< glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()))
																				<< glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()))
																				<< glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource(false).c_str()))
																				<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()))));

	m_testCtx.getLog()
		<< tcu::TestLog::Section("Program", "Shader program")
		<< *m_basicProgram
		<< tcu::TestLog::EndSection;

	if (!m_basicProgram->isOk())
		throw tcu::TestError("shader build failed");

	if (!m_useGlobalState)
	{
		m_perPrimitiveProgram = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(),
																					   glu::ProgramSources()
																							<< glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()))
																							<< glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()))
																							<< glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource(true).c_str()))
																							<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()))));

		m_testCtx.getLog()
			<< tcu::TestLog::Section("PerPrimitiveProgram", "Shader program that sets the bounding box")
			<< *m_perPrimitiveProgram
			<< tcu::TestLog::EndSection;

		if (!m_perPrimitiveProgram->isOk())
			throw tcu::TestError("shader build failed");
	}
}